

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O3

void __thiscall ON_SimpleArray<ON_3dex>::Append(ON_SimpleArray<ON_3dex> *this,ON_3dex *x)

{
  int iVar1;
  uint uVar2;
  ON_3dex *pOVar3;
  ON_3dex *pOVar4;
  uint uVar5;
  
  uVar2 = this->m_count;
  pOVar3 = x;
  if (uVar2 == this->m_capacity) {
    if (((int)uVar2 < 8) || ((ulong)((long)(int)uVar2 * 0xc) < 0x10000001)) {
      uVar5 = 4;
      if (2 < (int)uVar2) {
        uVar5 = uVar2 * 2;
      }
    }
    else {
      uVar5 = 0x155555d;
      if (uVar2 < 0x155555d) {
        uVar5 = uVar2;
      }
      uVar5 = uVar5 + uVar2;
    }
    if (x < this->m_a + (int)uVar2 && this->m_a <= x) {
      pOVar3 = (ON_3dex *)onmalloc(0xc);
      pOVar3->k = x->k;
      iVar1 = x->j;
      pOVar3->i = x->i;
      pOVar3->j = iVar1;
      uVar2 = this->m_capacity;
    }
    if (uVar2 < uVar5) {
      SetCapacity(this,(long)(int)uVar5);
    }
    pOVar4 = this->m_a;
    if (pOVar4 == (ON_3dex *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x1f0,"","allocation failure");
      return;
    }
    uVar2 = this->m_count;
  }
  else {
    pOVar4 = this->m_a;
  }
  this->m_count = uVar2 + 1;
  pOVar4[(int)uVar2].k = pOVar3->k;
  iVar1 = pOVar3->j;
  pOVar4[(int)uVar2].i = pOVar3->i;
  pOVar4[(int)uVar2].j = iVar1;
  if (pOVar3 != x) {
    onfree(pOVar3);
    return;
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( const T& x ) 
{
  const T* p = &x;
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if ( p >= m_a && p < (m_a + m_capacity) )
    {
      // 26 Sep 2005 Dale Lear
      // x is in the block of memory about to be reallocated.
      void* temp = onmalloc(sizeof(T));
      memcpy(temp, (void*)p, sizeof(T));
      p = (T*)temp;
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = *p;
  if (p != &x)
    onfree((void*)p);
}